

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O0

QpVector * __thiscall
Basis::ftran(Basis *this,QpVector *rhs,QpVector *target,bool buffer,HighsInt q)

{
  reference pvVar1;
  reference pvVar2;
  QpVector *pQVar3;
  byte in_CL;
  double in_RDI;
  undefined4 in_R8D;
  HighsInt i;
  HVector rhs_hvec;
  undefined4 in_stack_ffffffffffffff00;
  value_type in_stack_ffffffffffffff04;
  HighsTimerClock *in_stack_ffffffffffffff08;
  value_type vVar4;
  HVector *vector;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  HVector *in_stack_ffffffffffffff28;
  Basis *in_stack_ffffffffffffff30;
  HVectorBase<double> *in_stack_ffffffffffffff38;
  HVectorBase<double> *in_stack_ffffffffffffff40;
  bool local_58;
  int local_54;
  vector<int,_std::allocator<int>_> vStack_50;
  vector<double,_std::allocator<double>_> vStack_38;
  undefined4 local_20;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_20 = in_R8D;
  vec2hvec(in_stack_ffffffffffffff30,(QpVector *)in_stack_ffffffffffffff28);
  vector = (HVector *)&stack0xffffffffffffff30;
  HVectorBase<double>::HVectorBase(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  HFactor::ftranCall((HFactor *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),vector
                     ,in_RDI,in_stack_ffffffffffffff08);
  if ((local_19 & 1) != 0) {
    HVectorBase<double>::copy<double>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    for (in_stack_ffffffffffffff20 = 0; in_stack_ffffffffffffff20 < local_54;
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&vStack_50,(long)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff04 = *pvVar1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)((long)in_RDI + 0xb30),
                          (long)in_stack_ffffffffffffff20);
      *pvVar1 = in_stack_ffffffffffffff04;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&vStack_38,(long)in_stack_ffffffffffffff20);
      vVar4 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xb48),
                          (long)in_stack_ffffffffffffff20);
      *pvVar2 = vVar4;
    }
    *(int *)((long)in_RDI + 0xb2c) = local_54;
    *(byte *)((long)in_RDI + 0xb28) = local_58 & 1;
    *(undefined4 *)((long)in_RDI + 0x9f8) = local_20;
  }
  pQVar3 = hvec2vec(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                    (QpVector *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  HVectorBase<double>::~HVectorBase
            ((HVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  return pQVar3;
}

Assistant:

QpVector& Basis::ftran(const QpVector& rhs, QpVector& target, bool buffer,
                       HighsInt q) {
  HVector rhs_hvec = vec2hvec(rhs);
  basisfactor.ftranCall(rhs_hvec, 1.0);
  if (buffer) {
    col_aq.copy(&rhs_hvec);
    for (HighsInt i = 0; i < rhs_hvec.packCount; i++) {
      col_aq.packIndex[i] = rhs_hvec.packIndex[i];
      col_aq.packValue[i] = rhs_hvec.packValue[i];
    }
    col_aq.packCount = rhs_hvec.packCount;
    col_aq.packFlag = rhs_hvec.packFlag;
    buffered_q = q;
  }

  return hvec2vec(rhs_hvec, target);
}